

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_dn_gets(char *buf,size_t size,mbedtls_x509_name *dn)

{
  size_t __maxlen;
  uchar uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  char *__format;
  ulong uVar7;
  char *pcVar8;
  char cVar9;
  char cVar10;
  ulong uVar11;
  byte bVar12;
  mbedtls_asn1_named_data *oid;
  ulong uVar13;
  bool bVar14;
  byte local_178 [8];
  char s [256];
  uchar *local_60;
  uchar *asn1_len_p;
  char *short_name;
  uchar local_46 [6];
  char *pcStack_40;
  uchar asn1_tag_len_buf [6];
  size_t local_38;
  
  asn1_len_p = (uchar *)0x0;
  memset(local_178,0,0x100);
  pcVar8 = (char *)size;
  if (dn != (mbedtls_x509_name *)0x0) {
    uVar1 = '\0';
    oid = dn;
    do {
      while ((oid->oid).p != (uchar *)0x0) {
        local_38 = size;
        if (oid != dn) {
          __format = " + ";
          if (uVar1 == '\0') {
            __format = ", ";
          }
          uVar2 = snprintf(buf,size,__format);
          if ((int)uVar2 < 0) {
            return -0x2980;
          }
          uVar5 = (ulong)uVar2;
          local_38 = size - uVar5;
          if (size < uVar5 || local_38 == 0) {
            return -0x2980;
          }
          buf = buf + uVar5;
        }
        iVar3 = (oid->val).tag;
        bVar14 = false;
        if ((iVar3 != 0xc) && (iVar3 != 0x13)) {
          bVar14 = iVar3 != 0x16;
        }
        iVar3 = mbedtls_oid_get_attr_short_name(&oid->oid,(char **)&asn1_len_p);
        if (iVar3 == 0) {
          uVar2 = snprintf(buf,local_38,"%s=",asn1_len_p);
        }
        else {
          uVar2 = mbedtls_oid_get_numeric_string(buf,local_38,&oid->oid);
          if ((int)uVar2 < 1) {
            if (uVar2 == 0xfffffff5) {
              return -0x2980;
            }
            uVar2 = snprintf(buf,local_38,"??=");
          }
          else {
            local_38 = local_38 - uVar2;
            buf = buf + uVar2;
            uVar2 = snprintf(buf,local_38,"=");
            bVar14 = true;
          }
        }
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar5 = (ulong)uVar2;
        __maxlen = local_38 - uVar5;
        if (local_38 < uVar5 || __maxlen == 0) {
          return -0x2980;
        }
        if (bVar14) {
          local_178[0] = 0x23;
          local_60 = (uchar *)&stack0xffffffffffffffc0;
          pcStack_40 = buf;
          iVar3 = mbedtls_asn1_write_len(&local_60,local_46,(oid->val).len);
          if (iVar3 < 0) {
            return -0x6e;
          }
          iVar4 = mbedtls_asn1_write_tag(&local_60,local_46,(uchar)(oid->val).tag);
          buf = pcStack_40;
          if (iVar4 < 0) {
            return -0x6e;
          }
          uVar2 = iVar4 + iVar3;
          if (uVar2 == 0) {
            uVar13 = 1;
          }
          else {
            uVar13 = 1;
            uVar7 = 0;
            do {
              if (uVar7 == 0x7f) {
                return -0x2980;
              }
              bVar12 = *(byte *)((long)&stack0xffffffffffffffc0 + (uVar7 - uVar2));
              cVar9 = '0';
              cVar10 = '0';
              if (0x9f < bVar12) {
                cVar10 = '7';
              }
              local_178[uVar7 * 2 + 1] = cVar10 + (bVar12 >> 4);
              if (9 < (bVar12 & 0xf)) {
                cVar9 = '7';
              }
              uVar13 = uVar13 + 2;
              local_178[uVar7 * 2 + 2] = cVar9 + (bVar12 & 0xf);
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
          }
          short_name = pcVar8;
          if ((oid->val).len != 0) {
            uVar7 = 0;
            do {
              if (0xfd < uVar13) {
                return -0x2980;
              }
              bVar12 = (oid->val).p[uVar7];
              cVar9 = '0';
              cVar10 = '0';
              if (0x9f < bVar12) {
                cVar10 = '7';
              }
              local_178[uVar13] = cVar10 + (bVar12 >> 4);
              if (9 < (bVar12 & 0xf)) {
                cVar9 = '7';
              }
              local_178[uVar13 + 1] = cVar9 + (bVar12 & 0xf);
              uVar13 = uVar13 + 2;
              uVar7 = uVar7 + 1;
            } while (uVar7 < (oid->val).len);
          }
        }
        else {
          uVar7 = (oid->val).len;
          if (uVar7 == 0) {
            uVar13 = 0;
            short_name = pcVar8;
          }
          else {
            uVar11 = 0;
            uVar13 = 0;
            short_name = pcVar8;
            pcStack_40 = buf;
            do {
              if (0xfe < uVar13) {
                return -0x2980;
              }
              bVar12 = (oid->val).p[uVar11];
              if (bVar12 == 0) {
                return -0x2380;
              }
              pvVar6 = memchr(",=+<>;\"\\",(uint)bVar12,9);
              if ((pvVar6 != (void *)0x0) ||
                 (((uVar11 == 0 && (pvVar6 = memchr("# ",(uint)bVar12,3), pvVar6 != (void *)0x0)) ||
                  (bVar12 == 0x20 && uVar11 == uVar7 - 1)))) {
                if (uVar13 == 0xfe) {
                  return -0x2980;
                }
                local_178[uVar13] = 0x5c;
                uVar13 = uVar13 + 1;
              }
              if ((byte)(bVar12 + 0x81) < 0xa1) {
                if (uVar13 - 0xfc < 0xffffffffffffff01) {
                  return -0x2980;
                }
                local_178[uVar13] = 0x5c;
                cVar9 = '7';
                if (bVar12 < 0xa0) {
                  cVar9 = '0';
                }
                local_178[uVar13 + 1] = cVar9 + (bVar12 >> 4);
                uVar13 = uVar13 + 2;
                cVar9 = '7';
                if ((bVar12 & 0xf) < 10) {
                  cVar9 = '0';
                }
                bVar12 = cVar9 + (bVar12 & 0xf);
              }
              local_178[uVar13] = bVar12;
              uVar11 = uVar11 + 1;
              uVar13 = uVar13 + 1;
              uVar7 = (oid->val).len;
              buf = pcStack_40;
            } while (uVar11 < uVar7);
          }
        }
        local_178[uVar13] = 0;
        uVar2 = snprintf(buf + uVar5,__maxlen,"%s",local_178);
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar7 = (ulong)uVar2;
        size = __maxlen - uVar7;
        if (__maxlen < uVar7 || size == 0) {
          return -0x2980;
        }
        buf = buf + uVar5 + uVar7;
        uVar1 = oid->next_merged;
        oid = oid->next;
        pcVar8 = short_name;
        if (oid == (mbedtls_asn1_named_data *)0x0) goto LAB_001b18c5;
      }
      oid = oid->next;
    } while (oid != (mbedtls_asn1_named_data *)0x0);
  }
LAB_001b18c5:
  return (int)pcVar8 - (int)size;
}

Assistant:

int mbedtls_x509_dn_gets(char *buf, size_t size, const mbedtls_x509_name *dn)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, n, asn1_len_size, asn1_tag_size, asn1_tag_len_buf_start;
    /* 6 is enough as our asn1 write functions only write one byte for the tag and at most five bytes for the length*/
    unsigned char asn1_tag_len_buf[6];
    unsigned char *asn1_len_p;
    unsigned char c, merge = 0;
    const mbedtls_x509_name *name;
    const char *short_name = NULL;
    char lowbits, highbits;
    char s[MBEDTLS_X509_MAX_DN_NAME_SIZE], *p;
    int print_hexstring;

    memset(s, 0, sizeof(s));

    name = dn;
    p = buf;
    n = size;

    while (name != NULL) {
        if (!name->oid.p) {
            name = name->next;
            continue;
        }

        if (name != dn) {
            ret = mbedtls_snprintf(p, n, merge ? " + " : ", ");
            MBEDTLS_X509_SAFE_SNPRINTF;
        }

        print_hexstring = (name->val.tag != MBEDTLS_ASN1_UTF8_STRING) &&
                          (name->val.tag != MBEDTLS_ASN1_PRINTABLE_STRING) &&
                          (name->val.tag != MBEDTLS_ASN1_IA5_STRING);

        if ((ret = mbedtls_oid_get_attr_short_name(&name->oid, &short_name)) == 0) {
            ret = mbedtls_snprintf(p, n, "%s=", short_name);
        } else {
            if ((ret = mbedtls_oid_get_numeric_string(p, n, &name->oid)) > 0) {
                n -= ret;
                p += ret;
                ret = mbedtls_snprintf(p, n, "=");
                print_hexstring = 1;
            } else if (ret == MBEDTLS_ERR_OID_BUF_TOO_SMALL) {
                return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
            } else {
                ret = mbedtls_snprintf(p, n, "\?\?=");
            }
        }
        MBEDTLS_X509_SAFE_SNPRINTF;

        if (print_hexstring) {
            s[0] = '#';

            asn1_len_p = asn1_tag_len_buf + sizeof(asn1_tag_len_buf);
            if ((ret = mbedtls_asn1_write_len(&asn1_len_p, asn1_tag_len_buf, name->val.len)) < 0) {
                return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            }
            asn1_len_size = ret;
            if ((ret = mbedtls_asn1_write_tag(&asn1_len_p, asn1_tag_len_buf, name->val.tag)) < 0) {
                return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            }
            asn1_tag_size = ret;
            asn1_tag_len_buf_start = sizeof(asn1_tag_len_buf) - asn1_len_size - asn1_tag_size;
            for (i = 0, j = 1; i < asn1_len_size + asn1_tag_size; i++) {
                if (j + 1 >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }
                c = asn1_tag_len_buf[asn1_tag_len_buf_start+i];
                lowbits = (c & 0x0F);
                highbits = c >> 4;
                s[j++] = nibble_to_hex_digit(highbits);
                s[j++] = nibble_to_hex_digit(lowbits);
            }
            for (i = 0; i < name->val.len; i++) {
                if (j + 1 >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }
                c = name->val.p[i];
                lowbits = (c & 0x0F);
                highbits = c >> 4;
                s[j++] = nibble_to_hex_digit(highbits);
                s[j++] = nibble_to_hex_digit(lowbits);
            }
        } else {
            for (i = 0, j = 0; i < name->val.len; i++, j++) {
                if (j >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                c = name->val.p[i];
                // Special characters requiring escaping, RFC 4514 Section 2.4
                if (c == '\0') {
                    return MBEDTLS_ERR_X509_INVALID_NAME;
                } else {
                    if (strchr(",=+<>;\"\\", c) ||
                        ((i == 0) && strchr("# ", c)) ||
                        ((i == name->val.len-1) && (c == ' '))) {
                        if (j + 1 >= sizeof(s) - 1) {
                            return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                        }
                        s[j++] = '\\';
                    }
                }
                if (c < 32 || c >= 127) {
                    if (j + 3 >= sizeof(s) - 1) {
                        return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                    }
                    s[j++] = '\\';
                    lowbits = (c & 0x0F);
                    highbits = c >> 4;
                    s[j++] = nibble_to_hex_digit(highbits);
                    s[j] = nibble_to_hex_digit(lowbits);
                } else {
                    s[j] = c;
                }
            }
        }
        s[j] = '\0';
        ret = mbedtls_snprintf(p, n, "%s", s);
        MBEDTLS_X509_SAFE_SNPRINTF;

        merge = name->next_merged;
        name = name->next;
    }

    return (int) (size - n);
}